

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscriber.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _Alloc_hider _Var1;
  key_t __key;
  int iVar2;
  ostream *poVar3;
  shared_ptr<opentracing::v3::Tracer> sVar4;
  string_view operation_name;
  string_view operation_name_00;
  initializer_list<opentracing::v3::option_wrapper<opentracing::v3::StartSpanOption>_> option_list;
  allocator local_239;
  shared_ptr<jaegertracing::logging::Logger> local_238;
  _Head_base<0UL,_jaegertracing::logging::Logger_*,_false> local_228;
  string local_220;
  shared_ptr<opentracing::v3::Tracer> tracer;
  Node configYAML;
  Config config;
  
  if (argc < 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"usage: ");
    poVar3 = std::operator<<(poVar3,*argv);
    std::operator<<(poVar3," <config-yaml-path>\n");
    iVar2 = 1;
  }
  else {
    std::__cxx11::string::string((string *)&config,argv[1],(allocator *)&local_220);
    YAML::LoadFile((string *)&configYAML);
    std::__cxx11::string::~string((string *)&config);
    jaegertracing::Config::parse(&config,&configYAML);
    std::__cxx11::string::string((string *)&local_220,"subscriber-service",&local_239);
    jaegertracing::logging::consoleLogger();
    std::__shared_ptr<jaegertracing::logging::Logger,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<jaegertracing::logging::Logger,std::default_delete<jaegertracing::logging::Logger>,void>
              ((__shared_ptr<jaegertracing::logging::Logger,(__gnu_cxx::_Lock_policy)2> *)&local_238
               ,(unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
                 *)&local_228);
    jaegertracing::Tracer::make((Tracer *)&tracer,&local_220,&config,&local_238);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_238.
                super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (local_228._M_head_impl != (Logger *)0x0) {
      (**(code **)(*(long *)local_228._M_head_impl + 8))();
    }
    std::__cxx11::string::~string((string *)&local_220);
    sVar4 = std::static_pointer_cast<opentracing::v3::Tracer,opentracing::v3::Tracer>
                      ((shared_ptr<opentracing::v3::Tracer> *)&local_238);
    opentracing::v3::Tracer::InitGlobal
              (&local_220,&local_238,
               sVar4.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._M_pi);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_220._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_238.
                super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    jaegertracing::Config::~Config(&config);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&configYAML.m_pMemory.
                super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    opentracing::v3::Tracer::Global();
    operation_name.length_ = (size_t)"setupSubscriberFunction";
    operation_name.data_ = (char *)config._0_8_;
    opentracing::v3::Tracer::StartSpan
              ((Tracer *)&local_238,operation_name,
               (initializer_list<opentracing::v3::option_wrapper<opentracing::v3::StartSpanOption>_>
               )ZEXT816(0x17));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&config._serviceName);
    __key = ftok("pub-sub",0x41);
    iVar2 = msgget(__key,0x3b6);
    opentracing::v3::Tracer::Global();
    config._serviceName._M_string_length =
         (**(code **)(*(long *)local_238.
                               super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + 0x50))();
    config._0_8_ = &PTR__StartSpanOption_00118ce0;
    config._serviceName._M_dataplus._M_p._0_4_ = 1;
    operation_name_00.length_ = (size_t)"tracedSubscribeSubroutine";
    operation_name_00.data_ = (char *)configYAML._0_8_;
    option_list._M_len = (size_type)&tracer;
    option_list._M_array = (iterator)0x19;
    tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&config;
    opentracing::v3::Tracer::StartSpan((Tracer *)&local_220,operation_name_00,option_list);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&configYAML.m_pMemory);
    msgrcv(iVar2,(anonymous_namespace)::message,0x40,1,0);
    _Var1._M_p = local_220._M_dataplus._M_p;
    opentracing::v3::Value::Value<50>
              ((Value *)&config,(char (*) [50])((anonymous_namespace)::message + 8));
    (**(code **)(*(long *)_Var1._M_p + 0x20))(_Var1._M_p,"message-recieved",0x10,&config);
    opentracing::v3::util::
    variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
    ::~variant((variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
                *)&config);
    poVar3 = std::operator<<((ostream *)&std::cout,"Message recieved is: ");
    poVar3 = std::operator<<(poVar3,(anonymous_namespace)::message + 8);
    std::endl<char,std::char_traits<char>>(poVar3);
    msgctl(iVar2,0,(msqid_ds *)0x0);
    if ((long *)local_220._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_220._M_dataplus._M_p + 8))();
    }
    if (local_238.super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      (**(code **)(*(long *)local_238.
                            super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + 8))();
    }
    opentracing::v3::Tracer::Global();
    (**(code **)(*(long *)config._0_8_ + 0x58))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&config._serviceName);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char* argv[])
{
    if (argc < 2) {
        std::cerr << "usage: " << argv[0] << " <config-yaml-path>\n";
        return 1;
    }

    setUpTracer(argv[1]);

    setUpSubscriber();

    opentracing::Tracer::Global()->Close();
    return 0;
}